

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall
TSMuxer::buildPesHeader(TSMuxer *this,uint8_t pesStreamID,AVPacket *avPacket,int pid)

{
  BaseAbstractStreamReader *pBVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  long dts;
  uint8_t *__dest;
  pointer local_8b8;
  int local_89c;
  reference local_898;
  pair<int,_int> *i;
  iterator __end1;
  iterator __begin1;
  PriorityDataInfo *__range1;
  int bufLen;
  undefined1 local_860 [4];
  int additionDataSize;
  PriorityDataInfo tmpPriorityData;
  AbstractStreamReader *ast;
  PESPacket *pesPacket;
  uint8_t tmpBuffer [2048];
  int64_t curPts;
  int64_t curDts;
  int pid_local;
  AVPacket *avPacket_local;
  uint8_t pesStreamID_local;
  TSMuxer *this_local;
  
  iVar5 = internalClockToPts(avPacket->dts);
  dts = iVar5 + this->m_timeOffset;
  iVar5 = internalClockToPts(avPacket->pts);
  tmpBuffer._2040_8_ = iVar5 + this->m_timeOffset;
  memset(&pesPacket,0,0x800);
  if (dts == tmpBuffer._2040_8_) {
    PESPacket::serialize((PESPacket *)&pesPacket,tmpBuffer._2040_8_,pesStreamID);
  }
  else {
    PESPacket::serialize((PESPacket *)&pesPacket,tmpBuffer._2040_8_,dts,pesStreamID);
  }
  this->m_lastPESDTS = dts;
  this->m_fullPesDTS = avPacket->dts;
  this->m_fullPesPTS = avPacket->pts;
  pesPacket._6_1_ = pesPacket._6_1_ | 4;
  if (avPacket->codec == (BaseAbstractStreamReader *)0x0) {
    local_8b8 = (pointer)0x0;
  }
  else {
    local_8b8 = (pointer)__dynamic_cast(avPacket->codec,&BaseAbstractStreamReader::typeinfo,
                                        &AbstractStreamReader::typeinfo,0);
  }
  tmpPriorityData.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_8b8;
  if (local_8b8 != (pointer)0x0) {
    (**(code **)((long)*local_8b8 + 0x50))(local_8b8,(PESPacket *)&pesPacket,avPacket);
  }
  if ((avPacket->flags & 2) != 0) {
    iVar4 = avPacket->size;
    bVar2 = PESPacket::getHeaderLength((PESPacket *)&pesPacket);
    PESPacket::setPacketLength((PESPacket *)&pesPacket,iVar4 + (uint)bVar2);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_860);
  pBVar1 = avPacket->codec;
  bVar2 = PESPacket::getHeaderLength((PESPacket *)&pesPacket);
  iVar4 = (*pBVar1->_vptr_BaseAbstractStreamReader[2])
                    (pBVar1,tmpBuffer + ((ulong)bVar2 - 8),tmpBuffer + 0x7f8,avPacket,local_860);
  bVar2 = PESPacket::getHeaderLength((PESPacket *)&pesPacket);
  MemoryBlock::resize(&this->m_pesData,(uint)bVar2 + iVar4);
  __dest = MemoryBlock::data(&this->m_pesData);
  memcpy(__dest,&pesPacket,(long)(int)((uint)bVar2 + iVar4));
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      local_860);
  i = (pair<int,_int> *)
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_860);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)&i);
    if (!bVar3) break;
    local_898 = __gnu_cxx::
                __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                ::operator*(&__end1);
    iVar4 = local_898->first;
    bVar2 = PESPacket::getHeaderLength((PESPacket *)&pesPacket);
    local_89c = iVar4 + (uint)bVar2;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &this->m_priorityData,&local_89c,&local_898->second);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_860);
  return;
}

Assistant:

void TSMuxer::buildPesHeader(const uint8_t pesStreamID, AVPacket& avPacket, int pid)
{
    const int64_t curDts = internalClockToPts(avPacket.dts) + m_timeOffset;
    const int64_t curPts = internalClockToPts(avPacket.pts) + m_timeOffset;
    uint8_t tmpBuffer[2048]{0};
    const auto pesPacket = reinterpret_cast<PESPacket*>(tmpBuffer);
    if (curDts != curPts)
        pesPacket->serialize(curPts, curDts, pesStreamID);
    else
        pesPacket->serialize(curPts, pesStreamID);
    m_lastPESDTS = curDts;
    m_fullPesDTS = avPacket.dts;
    m_fullPesPTS = avPacket.pts;
    pesPacket->flagsHi |= PES_DATA_ALIGNMENT;
    // int additionDataSize = avPacket.codec->writePESExtension(pesPacket);
    const auto ast = dynamic_cast<AbstractStreamReader*>(avPacket.codec);
    if (ast)
        ast->writePESExtension(pesPacket, avPacket);
    if (avPacket.flags & AVPacket::IS_COMPLETE_FRAME)
        pesPacket->setPacketLength(avPacket.size + pesPacket->getHeaderLength());

    PriorityDataInfo tmpPriorityData;
    const int additionDataSize = avPacket.codec->writeAdditionData(
        tmpBuffer + pesPacket->getHeaderLength(), tmpBuffer + sizeof(tmpBuffer), avPacket, &tmpPriorityData);
    const int bufLen = pesPacket->getHeaderLength() + additionDataSize;
    m_pesData.resize(bufLen);
    memcpy(m_pesData.data(), tmpBuffer, bufLen);
    for (auto& i : tmpPriorityData) m_priorityData.emplace_back(i.first + pesPacket->getHeaderLength(), i.second);
}